

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void build_alloc(void *base,guard *guard,size_t size)

{
  memdesc *pmVar1;
  unsigned_long uVar2;
  memdesc *local_28;
  memdesc *desc;
  size_t size_local;
  guard *guard_local;
  void *base_local;
  
  LOCK(&descriptors_lock);
  pmVar1 = hdbg.descriptors.tqh_first;
  if (hdbg.descriptors.tqh_first == (memdesc *)0x0) {
    UNLOCK(&descriptors_lock);
    local_28 = (memdesc *)(*real_malloc)((hdbg.maxframes - 1) * 8 + 0x38);
  }
  else {
    local_28 = hdbg.descriptors.tqh_first;
    if (((hdbg.descriptors.tqh_first)->node).tqe_next == (memdesc *)0x0) {
      hdbg.descriptors.tqh_last = ((hdbg.descriptors.tqh_first)->node).tqe_prev;
    }
    else {
      ((((hdbg.descriptors.tqh_first)->node).tqe_next)->node).tqe_prev =
           ((hdbg.descriptors.tqh_first)->node).tqe_prev;
    }
    *(pmVar1->node).tqe_prev = (pmVar1->node).tqe_next;
    UNLOCK(&descriptors_lock);
  }
  guard->desc = local_28;
  local_28->data = guard;
  local_28->len = size;
  local_28->base = base;
  set_state(local_28,mem_allocated);
  getstacktrace(local_28->stack,(int)hdbg.maxframes);
  LOCK(&heap_lock);
  uVar2 = hdbg.serial + 1;
  local_28->serial = hdbg.serial;
  hdbg.serial = uVar2;
  hdbg.stats.alloc_total = size + hdbg.stats.alloc_total;
  if (hdbg.stats.maxmem < hdbg.stats.alloc_total) {
    if ((hdbg.alloc_limit != 0) && (hdbg.alloc_limit < hdbg.stats.alloc_total)) {
      hdbg.stats.maxmem = hdbg.stats.alloc_total;
      die("exceeded set memory limit");
    }
    hdbg.stats.maxmem = hdbg.stats.alloc_total;
  }
  pmVar1 = hdbg.heap.tqh_first;
  (local_28->node).tqe_next = hdbg.heap.tqh_first;
  if (pmVar1 == (memdesc *)0x0) {
    hdbg.heap.tqh_last = (memdesc **)local_28;
  }
  else {
    ((hdbg.heap.tqh_first)->node).tqe_prev = (memdesc **)local_28;
  }
  hdbg.heap.tqh_first = local_28;
  (local_28->node).tqe_prev = (memdesc **)&hdbg;
  UNLOCK(&heap_lock);
  fill(guard + 1,(int)size,0xbaadf00d);
  return;
}

Assistant:

static inline void build_alloc(void *base, struct guard *guard, size_t size) {
    struct memdesc *desc;
    LOCK(&descriptors_lock);
    if (TAILQ_EMPTY(&hdbg.descriptors)) {
        UNLOCK(&descriptors_lock);
        desc = real_malloc(sizeof (struct memdesc) +
              sizeof (void *) * (hdbg.maxframes - 1));
    } else {
        desc = TAILQ_FIRST(&hdbg.descriptors);
        TAILQ_REMOVE(&hdbg.descriptors, desc, node);
        UNLOCK(&descriptors_lock);
    }
    guard->desc = desc;
    desc->data = guard;
    desc->len = size;
    desc->base = base;
    set_state(desc, mem_allocated);
    getstacktrace(desc->stack, hdbg.maxframes);

    LOCK(&heap_lock);
    desc->serial = hdbg.serial++;
    hdbg.stats.alloc_total += size;
    if (hdbg.stats.alloc_total > hdbg.stats.maxmem) {
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
        if (hdbg.alloc_limit && hdbg.stats.alloc_total > hdbg.alloc_limit)
           die("exceeded set memory limit");
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
    }
    TAILQ_INSERT_HEAD(&hdbg.heap, desc, node);
    UNLOCK(&heap_lock);
    fill(guard + 1, size, 0xbaadf00d);
}